

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O3

ai_real __thiscall
Assimp::ImproveCacheLocalityProcess::ProcessMesh
          (ImproveCacheLocalityProcess *this,aiMesh *pMesh,uint meshNum)

{
  uint *puVar1;
  bool bVar2;
  uint *puVar3;
  aiFace *paVar4;
  void *__s;
  Logger *pLVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  aiFace *paVar17;
  ulong uVar18;
  ulong uVar19;
  ai_real aVar20;
  float fVar21;
  stack<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> sDeadEndVStack;
  vector<unsigned_int,_std::allocator<unsigned_int>_> piNumTriPtrNoModify;
  VertexTriangleAdjacency adj;
  char szBuff [128];
  float local_2c4;
  int local_2b0;
  uint local_2ac;
  uint *local_2a8;
  iterator iStack_2a0;
  uint *local_298;
  uint *local_288;
  uint *local_280;
  void *local_278;
  uint local_26c;
  int local_268;
  int local_264;
  ulong local_260;
  uint *local_258;
  aiFace *local_250;
  ulong local_248;
  aiMesh *local_240;
  ulong local_238;
  uint *local_230;
  void *local_228 [2];
  long local_218;
  VertexTriangleAdjacency local_210;
  vector<bool,_std::allocator<bool>_> local_1f0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                  ,0x7a,
                  "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)"
                 );
  }
  if (pMesh->mNumFaces == 0 || pMesh->mFaces == (aiFace *)0x0) {
    return 0.0;
  }
  if (pMesh->mNumVertices == 0 || pMesh->mVertices == (aiVector3D *)0x0) {
    return 0.0;
  }
  if (pMesh->mPrimitiveTypes != 4) {
    pLVar5 = DefaultLogger::get();
    Logger::error(pLVar5,"This algorithm works on triangle meshes only");
    return 0.0;
  }
  if (pMesh->mNumVertices <= this->mConfigCacheDepth) {
    return 0.0;
  }
  paVar17 = pMesh->mFaces + pMesh->mNumFaces;
  bVar2 = DefaultLogger::isNullLogger();
  if (bVar2) {
    uVar16 = pMesh->mNumFaces;
    local_2c4 = 3.0;
  }
  else {
    uVar16 = this->mConfigCacheDepth;
    uVar19 = (ulong)uVar16 * 4;
    puVar3 = (uint *)operator_new__(uVar19);
    memset(puVar3,0xff,uVar19);
    paVar4 = pMesh->mFaces;
    if (paVar4 == paVar17) {
      local_2c4 = 0.0;
    }
    else {
      uVar6 = 0;
      puVar8 = puVar3;
      do {
        lVar11 = 0;
        do {
          puVar13 = puVar3;
          if (uVar16 != 0) {
            do {
              if (*puVar13 == paVar4->mIndices[lVar11]) goto LAB_003bffe1;
              puVar13 = puVar13 + 1;
            } while (puVar13 < puVar3 + uVar16);
          }
          uVar6 = uVar6 + 1;
          if (puVar3 + uVar16 == puVar8) {
            puVar8 = puVar3;
          }
          *puVar8 = paVar4->mIndices[lVar11];
          puVar8 = puVar8 + 1;
LAB_003bffe1:
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        paVar4 = paVar4 + 1;
      } while (paVar4 != paVar17);
      local_2c4 = (float)uVar6;
    }
    operator_delete__(puVar3);
    uVar16 = pMesh->mNumFaces;
    local_2c4 = local_2c4 / (float)uVar16;
    if ((local_2c4 == 3.0) && (!NAN(local_2c4))) {
      snprintf(local_1a8,0x80,"Mesh %u: Not suitable for vcache optimization",(ulong)meshNum);
      pLVar5 = DefaultLogger::get();
      Logger::warn(pLVar5,local_1a8);
      return 0.0;
    }
  }
  VertexTriangleAdjacency::VertexTriangleAdjacency
            (&local_210,pMesh->mFaces,uVar16,pMesh->mNumVertices,true);
  uVar19 = (ulong)pMesh->mNumVertices << 2;
  __s = operator_new__(uVar19);
  memset(__s,0,uVar19);
  uVar16 = pMesh->mNumFaces;
  local_288 = (uint *)operator_new__((ulong)(uVar16 * 3) << 2);
  local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1f0,(ulong)uVar16,(bool *)local_1a8,(allocator_type *)local_1c8);
  puVar3 = local_210.mLiveTriangles;
  local_2a8 = (uint *)0x0;
  iStack_2a0._M_current = (uint *)0x0;
  local_298 = (uint *)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_228,local_210.mLiveTriangles
             ,local_210.mLiveTriangles + pMesh->mNumVertices,(allocator_type *)local_1a8);
  if ((ulong)pMesh->mNumVertices != 0) {
    lVar11 = 0;
    uVar16 = 0;
    do {
      uVar6 = *(uint *)((long)local_210.mLiveTriangles + lVar11);
      if (*(uint *)((long)local_210.mLiveTriangles + lVar11) < uVar16) {
        uVar6 = uVar16;
      }
      uVar16 = uVar6;
      lVar11 = lVar11 + 4;
    } while ((ulong)pMesh->mNumVertices << 2 != lVar11);
    if (uVar16 != 0) {
      local_26c = meshNum;
      local_250 = paVar17;
      local_280 = (uint *)operator_new__((ulong)(uVar16 * 3) << 2);
      iVar9 = this->mConfigCacheDepth + 1;
      local_2b0 = 1;
      uVar19 = 0;
      local_2ac = 0;
      local_258 = local_288;
      local_278 = __s;
      local_240 = pMesh;
      do {
        uVar16 = (uint)uVar19;
        if (local_210.mNumVertices <= uVar16) {
          __assert_fail("iVertIndex < mNumVertices",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/VertexTriangleAdjacency.h"
                        ,0x57,
                        "unsigned int *Assimp::VertexTriangleAdjacency::GetAdjacentTriangles(unsigned int) const"
                       );
        }
        uVar19 = uVar19 & 0xffffffff;
        iVar10 = *(int *)((long)local_228[0] + uVar19 * 4);
        if (iVar10 == 0) {
          puVar3[uVar19] = 0;
LAB_003c03a3:
          do {
            puVar8 = iStack_2a0._M_current + -1;
            if (iStack_2a0._M_current == local_2a8) goto LAB_003c03ca;
            uVar19 = (ulong)*puVar8;
            iStack_2a0._M_current = puVar8;
          } while (puVar3[uVar19] == 0);
          if (*puVar8 == 0xffffffff) {
LAB_003c03ca:
            uVar7 = (long)local_2b0;
            do {
              if ((long)(int)pMesh->mNumVertices <= (long)uVar7) goto LAB_003c03f9;
              uVar19 = uVar7 + 1;
              lVar11 = uVar7 + 1;
              uVar7 = uVar19;
            } while (puVar3[lVar11] == 0);
            local_2b0 = (int)uVar19;
          }
        }
        else {
          puVar8 = local_210.mAdjacencyTable + local_210.mOffsetTable[uVar19];
          iVar12 = 0;
          puVar13 = local_280;
          local_268 = iVar10;
          local_248 = uVar19;
          do {
            uVar6 = *puVar8;
            uVar7 = (ulong)uVar6;
            uVar14 = 1L << ((byte)uVar6 & 0x3f);
            uVar15 = (ulong)(uVar6 >> 6);
            uVar19 = local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15];
            if ((uVar19 >> (uVar7 & 0x3f) & 1) == 0) {
              paVar17 = pMesh->mFaces;
              uVar18 = (ulong)paVar17[uVar7].mNumIndices;
              local_264 = iVar12;
              local_260 = uVar15;
              local_238 = uVar14;
              local_230 = puVar8;
              if (uVar18 != 0) {
                lVar11 = 0;
                do {
                  local_1a8._0_4_ = *(uint *)((long)paVar17[uVar7].mIndices + lVar11);
                  uVar6 = uVar16;
                  if (uVar16 != local_1a8._0_4_) {
                    if (iStack_2a0._M_current == local_298) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2a8,
                                 iStack_2a0,(uint *)local_1a8);
                    }
                    else {
                      *iStack_2a0._M_current = local_1a8._0_4_;
                      iStack_2a0._M_current = iStack_2a0._M_current + 1;
                    }
                    *puVar13 = local_1a8._0_4_;
                    puVar13 = puVar13 + 1;
                    puVar3[(uint)local_1a8._0_4_] = puVar3[(uint)local_1a8._0_4_] - 1;
                    uVar6 = local_1a8._0_4_;
                  }
                  *(uint *)((long)local_258 + lVar11) = uVar6;
                  if (this->mConfigCacheDepth <
                      (uint)(iVar9 - *(int *)((long)local_278 + (ulong)(uint)local_1a8._0_4_ * 4)))
                  {
                    *(int *)((long)local_278 + (ulong)(uint)local_1a8._0_4_ * 4) = iVar9;
                    iVar9 = iVar9 + 1;
                    local_2ac = local_2ac + 1;
                  }
                  lVar11 = lVar11 + 4;
                } while (uVar18 << 2 != lVar11);
                uVar19 = local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_260];
                local_258 = (uint *)((long)local_258 + lVar11);
                pMesh = local_240;
              }
              local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[local_260] = uVar19 | local_238;
              __s = local_278;
              puVar8 = local_230;
              iVar10 = local_268;
              iVar12 = local_264;
            }
            puVar8 = puVar8 + 1;
            iVar12 = iVar12 + 1;
          } while (iVar12 != iVar10);
          puVar3[local_248] = 0;
          if (local_280 == puVar13) goto LAB_003c03a3;
          iVar10 = -1;
          uVar19 = 0xffffffff;
          puVar8 = local_280;
          do {
            uVar16 = *puVar8;
            if (puVar3[uVar16] != 0) {
              iVar12 = iVar9 - *(int *)((long)__s + (ulong)uVar16 * 4);
              if (this->mConfigCacheDepth < iVar12 + puVar3[uVar16] * 2) {
                iVar12 = 0;
              }
              if (iVar10 < iVar12) {
                uVar19 = (ulong)uVar16;
                iVar10 = iVar12;
              }
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar13);
          if ((int)uVar19 == -1) goto LAB_003c03a3;
        }
        if ((int)uVar19 < 0) {
LAB_003c03f9:
          bVar2 = DefaultLogger::isNullLogger();
          paVar17 = local_250;
          puVar3 = local_280;
          aVar20 = 0.0;
          if (!bVar2) {
            uVar16 = pMesh->mNumFaces;
            pLVar5 = DefaultLogger::get();
            fVar21 = (float)local_2ac / (float)uVar16;
            if (pLVar5->m_Severity == VERBOSE) {
              pLVar5 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[20]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [20])"Mesh %u | ACMR in: ");
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," out: ",6);
              std::ostream::_M_insert<double>((double)local_2c4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," | ~",4);
              std::ostream::_M_insert<double>((double)fVar21);
              std::ostream::_M_insert<double>((double)(((local_2c4 - fVar21) / local_2c4) * 100.0));
              std::__cxx11::stringbuf::str();
              Logger::debug(pLVar5,(char *)local_1c8[0]);
              if (local_1c8[0] != local_1b8) {
                operator_delete(local_1c8[0],local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            }
            aVar20 = fVar21 * (float)pMesh->mNumFaces;
          }
          puVar8 = local_288;
          for (paVar4 = pMesh->mFaces; paVar4 != paVar17; paVar4 = paVar4 + 1) {
            uVar16 = paVar4->mNumIndices;
            if (uVar16 != 0) {
              puVar13 = paVar4->mIndices;
              *puVar13 = *puVar8;
              if (uVar16 == 1) {
                puVar8 = puVar8 + 1;
              }
              else {
                puVar13[1] = puVar8[1];
                if (uVar16 < 3) {
                  puVar8 = puVar8 + 2;
                }
                else {
                  puVar1 = puVar8 + 2;
                  puVar8 = puVar8 + 3;
                  puVar13[2] = *puVar1;
                }
              }
            }
          }
          operator_delete__(local_278);
          operator_delete__(local_288);
          operator_delete__(puVar3);
          if (local_228[0] != (void *)0x0) {
            operator_delete(local_228[0],local_218 - (long)local_228[0]);
          }
          if (local_2a8 != (uint *)0x0) {
            operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
          }
          if (local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage -
                            (long)local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          }
          VertexTriangleAdjacency::~VertexTriangleAdjacency(&local_210);
          return aVar20;
        }
      } while( true );
    }
  }
  __assert_fail("iMaxRefTris > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/ImproveCacheLocality.cpp"
                ,0xda,
                "ai_real Assimp::ImproveCacheLocalityProcess::ProcessMesh(aiMesh *, unsigned int)");
}

Assistant:

ai_real ImproveCacheLocalityProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshNum) {
    // TODO: rewrite this to use std::vector or boost::shared_array
    ai_assert(nullptr != pMesh);

    // Check whether the input data is valid
    // - there must be vertices and faces
    // - all faces must be triangulated or we can't operate on them
    if (!pMesh->HasFaces() || !pMesh->HasPositions())
        return static_cast<ai_real>(0.f);

    if (pMesh->mPrimitiveTypes != aiPrimitiveType_TRIANGLE) {
        ASSIMP_LOG_ERROR("This algorithm works on triangle meshes only");
        return static_cast<ai_real>(0.f);
    }

    if(pMesh->mNumVertices <= mConfigCacheDepth) {
        return static_cast<ai_real>(0.f);
    }

    ai_real fACMR = 3.f;
    const aiFace* const pcEnd = pMesh->mFaces+pMesh->mNumFaces;

    // Input ACMR is for logging purposes only
    if (!DefaultLogger::isNullLogger())     {

        unsigned int* piFIFOStack = new unsigned int[mConfigCacheDepth];
        memset(piFIFOStack,0xff,mConfigCacheDepth*sizeof(unsigned int));
        unsigned int* piCur = piFIFOStack;
        const unsigned int* const piCurEnd = piFIFOStack + mConfigCacheDepth;

        // count the number of cache misses
        unsigned int iCacheMisses = 0;
        for (const aiFace* pcFace = pMesh->mFaces;pcFace != pcEnd;++pcFace) {
            for (unsigned int qq = 0; qq < 3;++qq) {
                bool bInCache = false;
                for (unsigned int* pp = piFIFOStack;pp < piCurEnd;++pp) {
                    if (*pp == pcFace->mIndices[qq])    {
                        // the vertex is in cache
                        bInCache = true;
                        break;
                    }
                }
                if (!bInCache)  {
                    ++iCacheMisses;
                    if (piCurEnd == piCur) {
                        piCur = piFIFOStack;
                    }
                    *piCur++ = pcFace->mIndices[qq];
                }
            }
        }
        delete[] piFIFOStack;
        fACMR = (ai_real) iCacheMisses / pMesh->mNumFaces;
        if (3.0 == fACMR)   {
            char szBuff[128]; // should be sufficiently large in every case

            // the JoinIdenticalVertices process has not been executed on this
            // mesh, otherwise this value would normally be at least minimally
            // smaller than 3.0 ...
            ai_snprintf(szBuff,128,"Mesh %u: Not suitable for vcache optimization",meshNum);
            ASSIMP_LOG_WARN(szBuff);
            return static_cast<ai_real>(0.f);
        }
    }

    // first we need to build a vertex-triangle adjacency list
    VertexTriangleAdjacency adj(pMesh->mFaces,pMesh->mNumFaces, pMesh->mNumVertices,true);

    // build a list to store per-vertex caching time stamps
    unsigned int* const piCachingStamps = new unsigned int[pMesh->mNumVertices];
    memset(piCachingStamps,0x0,pMesh->mNumVertices*sizeof(unsigned int));

    // allocate an empty output index buffer. We store the output indices in one large array.
    // Since the number of triangles won't change the input faces can be reused. This is how
    // we save thousands of redundant mini allocations for aiFace::mIndices
    const unsigned int iIdxCnt = pMesh->mNumFaces*3;
    unsigned int* const piIBOutput = new unsigned int[iIdxCnt];
    unsigned int* piCSIter = piIBOutput;

    // allocate the flag array to hold the information
    // whether a face has already been emitted or not
    std::vector<bool> abEmitted(pMesh->mNumFaces,false);

    // dead-end vertex index stack
    std::stack<unsigned int, std::vector<unsigned int> > sDeadEndVStack;

    // create a copy of the piNumTriPtr buffer
    unsigned int* const piNumTriPtr = adj.mLiveTriangles;
    const std::vector<unsigned int> piNumTriPtrNoModify(piNumTriPtr, piNumTriPtr + pMesh->mNumVertices);

    // get the largest number of referenced triangles and allocate the "candidate buffer"
    unsigned int iMaxRefTris = 0; {
        const unsigned int* piCur = adj.mLiveTriangles;
        const unsigned int* const piCurEnd = adj.mLiveTriangles+pMesh->mNumVertices;
        for (;piCur != piCurEnd;++piCur) {
            iMaxRefTris = std::max(iMaxRefTris,*piCur);
        }
    }
    ai_assert(iMaxRefTris > 0);
    unsigned int* piCandidates = new unsigned int[iMaxRefTris*3];
    unsigned int iCacheMisses = 0;

    // ...................................................................................
    /** PSEUDOCODE for the algorithm

        A = Build-Adjacency(I) Vertex-triangle adjacency
        L = Get-Triangle-Counts(A) Per-vertex live triangle counts
        C = Zero(Vertex-Count(I)) Per-vertex caching time stamps
        D = Empty-Stack() Dead-end vertex stack
        E = False(Triangle-Count(I)) Per triangle emitted flag
        O = Empty-Index-Buffer() Empty output buffer
        f = 0 Arbitrary starting vertex
        s = k+1, i = 1 Time stamp and cursor
        while f >= 0 For all valid fanning vertices
            N = Empty-Set() 1-ring of next candidates
            for each Triangle t in Neighbors(A, f)
                if !Emitted(E,t)
                    for each Vertex v in t
                        Append(O,v) Output vertex
                        Push(D,v) Add to dead-end stack
                        Insert(N,v) Register as candidate
                        L[v] = L[v]-1 Decrease live triangle count
                        if s-C[v] > k If not in cache
                            C[v] = s Set time stamp
                            s = s+1 Increment time stamp
                    E[t] = true Flag triangle as emitted
            Select next fanning vertex
            f = Get-Next-Vertex(I,i,k,N,C,s,L,D)
        return O
        */
    // ...................................................................................

    int ivdx = 0;
    int ics = 1;
    int iStampCnt = mConfigCacheDepth+1;
    while (ivdx >= 0)   {

        unsigned int icnt = piNumTriPtrNoModify[ivdx];
        unsigned int* piList = adj.GetAdjacentTriangles(ivdx);
        unsigned int* piCurCandidate = piCandidates;

        // get all triangles in the neighborhood
        for (unsigned int tri = 0; tri < icnt;++tri)    {

            // if they have not yet been emitted, add them to the output IB
            const unsigned int fidx = *piList++;
            if (!abEmitted[fidx])   {

                // so iterate through all vertices of the current triangle
                const aiFace* pcFace = &pMesh->mFaces[ fidx ];
                unsigned nind = pcFace->mNumIndices;
                for (unsigned ind = 0; ind < nind; ind++) {
                    unsigned dp = pcFace->mIndices[ind];

                    // the current vertex won't have any free triangles after this step
                    if (ivdx != (int)dp) {
                        // append the vertex to the dead-end stack
                        sDeadEndVStack.push(dp);

                        // register as candidate for the next step
                        *piCurCandidate++ = dp;

                        // decrease the per-vertex triangle counts
                        piNumTriPtr[dp]--;
                    }

                    // append the vertex to the output index buffer
                    *piCSIter++ = dp;

                    // if the vertex is not yet in cache, set its cache count
                    if (iStampCnt-piCachingStamps[dp] > mConfigCacheDepth) {
                        piCachingStamps[dp] = iStampCnt++;
                        ++iCacheMisses;
                    }
                }
                // flag triangle as emitted
                abEmitted[fidx] = true;
            }
        }

        // the vertex has now no living adjacent triangles anymore
        piNumTriPtr[ivdx] = 0;

        // get next fanning vertex
        ivdx = -1;
        int max_priority = -1;
        for (unsigned int* piCur = piCandidates;piCur != piCurCandidate;++piCur)    {
            const unsigned int dp = *piCur;

            // must have live triangles
            if (piNumTriPtr[dp] > 0)    {
                int priority = 0;

                // will the vertex be in cache, even after fanning occurs?
                unsigned int tmp;
                if ((tmp = iStampCnt-piCachingStamps[dp]) + 2*piNumTriPtr[dp] <= mConfigCacheDepth) {
                    priority = tmp;
                }

                // keep best candidate
                if (priority > max_priority) {
                    max_priority = priority;
                    ivdx = dp;
                }
            }
        }
        // did we reach a dead end?
        if (-1 == ivdx) {
            // need to get a non-local vertex for which we have a good chance that it is still
            // in the cache ...
            while (!sDeadEndVStack.empty()) {
                unsigned int iCachedIdx = sDeadEndVStack.top();
                sDeadEndVStack.pop();
                if (piNumTriPtr[ iCachedIdx ] > 0)  {
                    ivdx = iCachedIdx;
                    break;
                }
            }

            if (-1 == ivdx) {
                // well, there isn't such a vertex. Simply get the next vertex in input order and
                // hope it is not too bad ...
                while (ics < (int)pMesh->mNumVertices)  {
                    ++ics;
                    if (piNumTriPtr[ics] > 0)   {
                        ivdx = ics;
                        break;
                    }
                }
            }
        }
    }
    ai_real fACMR2 = 0.0f;
    if (!DefaultLogger::isNullLogger()) {
        fACMR2 = (float)iCacheMisses / pMesh->mNumFaces;

        // very intense verbose logging ... prepare for much text if there are many meshes
        if ( DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE) {
            ASSIMP_LOG_DEBUG_F("Mesh %u | ACMR in: ", meshNum, " out: ", fACMR, " | ~", fACMR2, ((fACMR - fACMR2) / fACMR) * 100.f);
        }

        fACMR2 *= pMesh->mNumFaces;
    }
    // sort the output index buffer back to the input array
    piCSIter = piIBOutput;
    for (aiFace* pcFace = pMesh->mFaces; pcFace != pcEnd;++pcFace)  {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) ind[0] = *piCSIter++;
        if (nind > 1) ind[1] = *piCSIter++;
        if (nind > 2) ind[2] = *piCSIter++;
    }

    // delete temporary storage
    delete[] piCachingStamps;
    delete[] piIBOutput;
    delete[] piCandidates;

    return fACMR2;
}